

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O2

void __thiscall
deqp::QuadGrid::QuadGrid
          (QuadGrid *this,int gridSize,int width,int height,Vec4 *constCoords,
          vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
          *userAttribTransforms,
          vector<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_> *textures)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_00;
  pointer pVVar1;
  pointer puVar2;
  int iVar3;
  unsigned_short uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int attribNdx;
  unsigned_short uVar17;
  int x;
  ulong uVar18;
  uint uVar19;
  float fx;
  float fy;
  Vector<float,_4> local_d8;
  float local_c8;
  uint uStack_c4;
  undefined4 uStack_c0;
  uint uStack_bc;
  float local_b8;
  uint uStack_b4;
  undefined4 uStack_b0;
  uint uStack_ac;
  float local_a8;
  undefined1 local_98 [36];
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  uint uStack_64;
  undefined4 uStack_60;
  uint uStack_5c;
  float local_58;
  pointer local_40;
  pointer pVStack_38;
  
  this->m_gridSize = gridSize;
  uVar5 = gridSize + 1;
  this->m_numVertices = uVar5 * uVar5;
  this->m_numTriangles = gridSize * gridSize * 2;
  tcu::Vector<float,_4>::Vector(&this->m_constCoords,constCoords);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            (&this->m_userAttribTransforms,userAttribTransforms);
  std::vector<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>::vector
            (&this->m_textures,textures);
  this_00 = &this->m_screenPos;
  memset(this_00,0,0xf0);
  uVar19 = 0;
  local_40 = (pointer)CONCAT44((float)height,(float)width);
  pVStack_38 = (pointer)0x0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_positions,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_coords,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_unitCoords,(long)this->m_numVertices);
  std::vector<float,_std::allocator<float>_>::resize(&this->m_attribOne,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (this_00,(long)this->m_numVertices);
  for (lVar10 = 200; lVar10 != 0x128; lVar10 = lVar10 + 0x18) {
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               ((long)(this->m_constCoords).m_data + lVar10 + -0xc),(long)this->m_numVertices);
  }
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar5) {
    uVar9 = uVar5;
  }
  local_98._16_4_ = 0.33;
  local_98._20_4_ = -0.275;
  local_98._24_8_ = 0;
  for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    local_b8 = (float)(int)uVar8 / (float)gridSize;
    local_c8 = local_b8 + local_b8 + -1.0;
    uStack_c0 = 0;
    local_68 = -local_c8;
    uStack_64 = height ^ 0x80000000;
    uStack_5c = uVar19 ^ 0x80000000;
    uStack_60 = 0x80000000;
    local_98._32_4_ = local_b8 * 0.25;
    fStack_74 = local_b8 * 0.5;
    fStack_70 = local_b8 * 0.0;
    fStack_6c = local_b8 * 0.0;
    uStack_b0 = 0;
    uStack_c4 = height;
    uStack_bc = uVar19;
    uStack_b4 = height;
    uStack_ac = uVar19;
    for (uVar18 = 0; uVar18 != uVar5; uVar18 = uVar18 + 1) {
      local_d8.m_data[0] = (float)(int)uVar18 / (float)gridSize;
      local_58 = local_d8.m_data[0] + local_d8.m_data[0] + -1.0;
      iVar6 = uVar8 * uVar5 + (int)uVar18;
      pVVar1 = (this->m_positions).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[iVar6].m_data[0] = local_58;
      pVVar1[iVar6].m_data[1] = local_c8;
      pVVar1[iVar6].m_data[2] = 0.0;
      pVVar1[iVar6].m_data[3] = 1.0;
      (this->m_attribOne).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[iVar6] = 1.0;
      local_d8.m_data[2] = 0.0;
      local_d8.m_data[3] = 1.0;
      local_d8.m_data[1] = local_b8;
      local_a8 = local_d8.m_data[0];
      tcu::operator*((tcu *)local_98,&local_d8,(Vector<float,_4> *)&local_40);
      pVVar1 = (this_00->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + iVar6;
      *(undefined8 *)pVVar1->m_data = local_98._0_8_;
      *(undefined8 *)(pVVar1->m_data + 2) = local_98._8_8_;
      pVVar1 = (this->m_coords).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[iVar6].m_data[0] = local_58;
      pVVar1[iVar6].m_data[1] = local_c8;
      *(ulong *)(pVVar1[iVar6].m_data + 2) =
           CONCAT44(local_58 * (float)local_98._20_4_ + local_68,
                    local_c8 * (float)local_98._16_4_ + -local_58);
      pVVar1 = (this->m_unitCoords).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[iVar6].m_data[0] = local_a8;
      pVVar1[iVar6].m_data[1] = local_b8;
      *(ulong *)(pVVar1[iVar6].m_data + 2) =
           CONCAT44(local_a8 * 0.5 + (float)local_98._32_4_,local_a8 * 0.33 + fStack_74);
      pvVar11 = this->m_userAttribs;
      for (lVar10 = 0;
          lVar10 < (int)((ulong)((long)(this->m_userAttribTransforms).
                                       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_userAttribTransforms).
                                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 6);
          lVar10 = lVar10 + 1) {
        getUserAttrib((QuadGrid *)local_98,(int)this,local_a8,local_b8);
        pVVar1 = (pvVar11->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start + iVar6;
        *(undefined8 *)pVVar1->m_data = local_98._0_8_;
        *(undefined8 *)(pVVar1->m_data + 2) = local_98._8_8_;
        pvVar11 = pvVar11 + 1;
      }
    }
    height = uStack_b4;
    uVar19 = uStack_ac;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->m_indices,(long)(this->m_numTriangles * 3));
  iVar7 = 0;
  iVar6 = 0;
  if (0 < gridSize) {
    iVar6 = gridSize;
  }
  iVar16 = gridSize + 2;
  iVar12 = 1;
  iVar13 = 0;
  while (iVar13 != iVar6) {
    iVar13 = iVar13 + 1;
    puVar2 = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar14 = iVar12;
    iVar15 = iVar16;
    for (lVar10 = 0; (ulong)(uint)gridSize * 6 - lVar10 != 0; lVar10 = lVar10 + 6) {
      iVar3 = (int)lVar10;
      uVar17 = (unsigned_short)iVar15 - 1;
      puVar2[iVar7 + iVar3] = uVar17;
      uVar4 = (unsigned_short)iVar14;
      puVar2[iVar7 + 1 + iVar3] = uVar4 - 1;
      puVar2[iVar7 + 2 + iVar3] = uVar4;
      puVar2[iVar7 + 3 + iVar3] = uVar17;
      puVar2[iVar7 + 4 + iVar3] = uVar4;
      puVar2[iVar7 + iVar3 + 5] = (unsigned_short)iVar15;
      iVar15 = iVar15 + 1;
      iVar14 = iVar14 + 1;
    }
    iVar7 = iVar7 + gridSize * 6;
    iVar16 = iVar16 + uVar5;
    iVar12 = iVar12 + uVar5;
  }
  return;
}

Assistant:

QuadGrid::QuadGrid(int gridSize, int width, int height, const Vec4& constCoords,
				   const vector<Mat4>& userAttribTransforms, const vector<TextureBinding>& textures)
	: m_gridSize(gridSize)
	, m_numVertices((gridSize + 1) * (gridSize + 1))
	, m_numTriangles(gridSize * gridSize * 2)
	, m_constCoords(constCoords)
	, m_userAttribTransforms(userAttribTransforms)
	, m_textures(textures)
{
	Vec4 viewportScale = Vec4((float)width, (float)height, 0.0f, 0.0f);

	// Compute vertices.
	m_positions.resize(m_numVertices);
	m_coords.resize(m_numVertices);
	m_unitCoords.resize(m_numVertices);
	m_attribOne.resize(m_numVertices);
	m_screenPos.resize(m_numVertices);

	// User attributes.
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(m_userAttribs); i++)
		m_userAttribs[i].resize(m_numVertices);

	for (int y = 0; y < gridSize + 1; y++)
		for (int x = 0; x < gridSize + 1; x++)
		{
			float sx	 = static_cast<float>(x) / static_cast<float>(gridSize);
			float sy	 = static_cast<float>(y) / static_cast<float>(gridSize);
			float fx	 = 2.0f * sx - 1.0f;
			float fy	 = 2.0f * sy - 1.0f;
			int   vtxNdx = ((y * (gridSize + 1)) + x);

			m_positions[vtxNdx]  = Vec4(fx, fy, 0.0f, 1.0f);
			m_attribOne[vtxNdx]  = 1.0f;
			m_screenPos[vtxNdx]  = Vec4(sx, sy, 0.0f, 1.0f) * viewportScale;
			m_coords[vtxNdx]	 = getCoords(sx, sy);
			m_unitCoords[vtxNdx] = getUnitCoords(sx, sy);

			for (int attribNdx					 = 0; attribNdx < getNumUserAttribs(); attribNdx++)
				m_userAttribs[attribNdx][vtxNdx] = getUserAttrib(attribNdx, sx, sy);
		}

	// Compute indices.
	m_indices.resize(3 * m_numTriangles);
	for (int y = 0; y < gridSize; y++)
		for (int x = 0; x < gridSize; x++)
		{
			int stride = gridSize + 1;
			int v00	= (y * stride) + x;
			int v01	= (y * stride) + x + 1;
			int v10	= ((y + 1) * stride) + x;
			int v11	= ((y + 1) * stride) + x + 1;

			int baseNdx			   = ((y * gridSize) + x) * 6;
			m_indices[baseNdx + 0] = static_cast<deUint16>(v10);
			m_indices[baseNdx + 1] = static_cast<deUint16>(v00);
			m_indices[baseNdx + 2] = static_cast<deUint16>(v01);

			m_indices[baseNdx + 3] = static_cast<deUint16>(v10);
			m_indices[baseNdx + 4] = static_cast<deUint16>(v01);
			m_indices[baseNdx + 5] = static_cast<deUint16>(v11);
		}
}